

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O2

CBString * __thiscall Bstrlib::CBString::operator+=(CBString *this,char c)

{
  int iVar1;
  CBStringException *this_00;
  allocator local_59;
  string local_58;
  CBStringException bstr__cppwrapper_exception;
  
  iVar1 = bconchar(&this->super_tagbstring,c);
  if (iVar1 != -1) {
    return this;
  }
  std::__cxx11::string::string((string *)&local_58,"CBString::Failure in concatenate",&local_59);
  CBStringException::CBStringException(&bstr__cppwrapper_exception,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  this_00 = (CBStringException *)__cxa_allocate_exception(0x28);
  CBStringException::CBStringException(this_00,&bstr__cppwrapper_exception);
  __cxa_throw(this_00,&CBStringException::typeinfo,CBStringException::~CBStringException);
}

Assistant:

const CBString& CBString::operator += (char c) {
	if (BSTR_ERR == bconchar (this, c)) {
		bstringThrow ("Failure in concatenate");
	}
	return *this;
}